

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O1

ErrorData * __thiscall
duckdb::DuckTransaction::WriteToWAL
          (ErrorData *__return_storage_ptr__,DuckTransaction *this,AttachedDatabase *db,
          unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>,_true>
          *commit_state)

{
  _Head_base<0UL,_duckdb::StorageCommitState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::StorageCommitState_*,_false> _Var2;
  int iVar3;
  StorageManager *this_00;
  pointer this_01;
  pointer pSVar4;
  undefined4 extraout_var;
  pointer *__ptr;
  optional_ptr<duckdb::WriteAheadLog,_true> log;
  _Head_base<0UL,_duckdb::StorageCommitState_*,_false> local_a8;
  optional_ptr<duckdb::WriteAheadLog,_true> local_a0 [16];
  
  ErrorData::ErrorData(__return_storage_ptr__);
  this_00 = AttachedDatabase::GetStorageManager(db);
  local_a0[0] = StorageManager::GetWAL(this_00);
  optional_ptr<duckdb::WriteAheadLog,_true>::CheckValid(local_a0);
  (*this_00->_vptr_StorageManager[3])(&local_a8,this_00,local_a0[0].ptr);
  _Var2._M_head_impl = local_a8._M_head_impl;
  local_a8._M_head_impl = (StorageCommitState *)0x0;
  _Var1._M_head_impl =
       (commit_state->
       super_unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::StorageCommitState_*,_std::default_delete<duckdb::StorageCommitState>_>
       .super__Head_base<0UL,_duckdb::StorageCommitState_*,_false>._M_head_impl;
  (commit_state->
  super_unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>).
  _M_t.
  super___uniq_ptr_impl<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageCommitState_*,_std::default_delete<duckdb::StorageCommitState>_>
  .super__Head_base<0UL,_duckdb::StorageCommitState_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (StorageCommitState *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_StorageCommitState[1])();
  }
  if (local_a8._M_head_impl != (StorageCommitState *)0x0) {
    (*(local_a8._M_head_impl)->_vptr_StorageCommitState[1])();
  }
  this_01 = unique_ptr<duckdb::LocalStorage,_std::default_delete<duckdb::LocalStorage>,_true>::
            operator->(&this->storage);
  LocalStorage::Commit
            (this_01,(optional_ptr<duckdb::StorageCommitState,_true>)
                     (commit_state->
                     super_unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::StorageCommitState_*,_std::default_delete<duckdb::StorageCommitState>_>
                     .super__Head_base<0UL,_duckdb::StorageCommitState_*,_false>._M_head_impl);
  optional_ptr<duckdb::WriteAheadLog,_true>::CheckValid(local_a0);
  UndoBuffer::WriteToWAL
            (&this->undo_buffer,local_a0[0].ptr,
             (optional_ptr<duckdb::StorageCommitState,_true>)
             (commit_state->
             super_unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::StorageCommitState_*,_std::default_delete<duckdb::StorageCommitState>_>
             .super__Head_base<0UL,_duckdb::StorageCommitState_*,_false>._M_head_impl);
  pSVar4 = unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>,_true>
           ::operator->(commit_state);
  iVar3 = (*pSVar4->_vptr_StorageCommitState[6])(pSVar4);
  if ((char)iVar3 != '\0') {
    iVar3 = (*this_00->_vptr_StorageManager[9])(this_00);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0xa0))
              ((long *)CONCAT44(extraout_var,iVar3));
  }
  if (((commit_state->
       super_unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::StorageCommitState_*,_std::default_delete<duckdb::StorageCommitState>_>
       .super__Head_base<0UL,_duckdb::StorageCommitState_*,_false>._M_head_impl !=
       (StorageCommitState *)0x0) && (__return_storage_ptr__->initialized == true)) {
    pSVar4 = unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>,_true>
             ::operator->(commit_state);
    (*pSVar4->_vptr_StorageCommitState[2])(pSVar4);
    _Var1._M_head_impl =
         (commit_state->
         super_unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::StorageCommitState_*,_std::default_delete<duckdb::StorageCommitState>_>
         .super__Head_base<0UL,_duckdb::StorageCommitState_*,_false>._M_head_impl;
    (commit_state->
    super_unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>).
    _M_t.
    super___uniq_ptr_impl<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::StorageCommitState_*,_std::default_delete<duckdb::StorageCommitState>_>
    .super__Head_base<0UL,_duckdb::StorageCommitState_*,_false>._M_head_impl =
         (StorageCommitState *)0x0;
    if (_Var1._M_head_impl != (StorageCommitState *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_StorageCommitState[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ErrorData DuckTransaction::WriteToWAL(AttachedDatabase &db, unique_ptr<StorageCommitState> &commit_state) noexcept {
	ErrorData error_data;
	try {
		D_ASSERT(ShouldWriteToWAL(db));
		auto &storage_manager = db.GetStorageManager();
		auto log = storage_manager.GetWAL();
		commit_state = storage_manager.GenStorageCommitState(*log);
		storage->Commit(commit_state.get());
		undo_buffer.WriteToWAL(*log, commit_state.get());
		if (commit_state->HasRowGroupData()) {
			// if we have optimistically written any data AND we are writing to the WAL, we have written references to
			// optimistically written blocks
			// hence we need to ensure those optimistically written blocks are persisted
			storage_manager.GetBlockManager().FileSync();
		}
	} catch (std::exception &ex) {
		// Call RevertCommit() outside this try-catch as it itself may throw
		error_data = ErrorData(ex);
	}

	if (commit_state && error_data.HasError()) {
		try {
			commit_state->RevertCommit();
			commit_state.reset();
		} catch (std::exception &) {
			// Ignore this error. If we fail to RevertCommit(), just return the original exception
		}
	}

	return error_data;
}